

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O1

void __thiscall o3dgc::Vector<char>::PushBack(Vector<char> *this,char *value)

{
  char cVar1;
  size_t __n;
  char *__src;
  ulong uVar2;
  char *__dest;
  ulong uVar3;
  
  __n = this->m_size;
  if (__n == this->m_allocated) {
    uVar2 = this->m_allocated * 2;
    uVar3 = 0x20;
    if (0x20 < uVar2) {
      uVar3 = uVar2;
    }
    this->m_allocated = uVar3;
    __dest = (char *)operator_new__(uVar3);
    if (__n != 0) {
      __src = this->m_buffer;
      memcpy(__dest,__src,__n);
      if (__src != (char *)0x0) {
        operator_delete__(__src);
      }
    }
    this->m_buffer = __dest;
  }
  uVar2 = this->m_size;
  if (uVar2 < this->m_allocated) {
    cVar1 = *value;
    this->m_size = uVar2 + 1;
    this->m_buffer[uVar2] = cVar1;
    return;
  }
  __assert_fail("m_size < m_allocated",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcVector.h"
                ,0x58,"void o3dgc::Vector<char>::PushBack(const T &) [T = char]");
}

Assistant:

void                    PushBack(const T & value)
                                {
                                    if (m_size == m_allocated)
                                    {
                                        m_allocated *= 2;
                                        if (m_allocated < O3DGC_DEFAULT_VECTOR_SIZE)
                                        {
                                            m_allocated = O3DGC_DEFAULT_VECTOR_SIZE;
                                        }
                                        T * tmp      = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                    assert(m_size < m_allocated);
                                    m_buffer[m_size++] = value;
                                }